

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

void __thiscall
chaiscript::Type_Conversions::add_conversion
          (Type_Conversions *this,shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion)

{
  element_type *peVar1;
  long lVar2;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  _Alloc_node __an;
  type_info *local_50 [2];
  unique_lock<chaiscript::detail::threading::shared_mutex> local_40;
  _Alloc_node local_30;
  
  local_40._M_owns = false;
  local_40._M_device = &this->m_mutex;
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::lock(&local_40);
  local_40._M_owns = true;
  std::
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::_M_insert_unique<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>const&>
            ((_Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)&this->m_conversions,conversion);
  peVar1 = (conversion->
           super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  local_50[0] = (peVar1->m_to).m_bare_type_info;
  local_50[1] = (peVar1->m_from).m_bare_type_info;
  lVar2 = 0;
  local_30._M_t = &(this->m_convertableTypes)._M_t;
  do {
    std::
    _Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
    ::
    _M_insert_unique_<std::type_info_const*const&,std::_Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>::_Alloc_node>
              ((_Rb_tree<std::type_info_const*,std::type_info_const*,std::_Identity<std::type_info_const*>,chaiscript::Type_Conversions::Less_Than,std::allocator<std::type_info_const*>>
                *)&this->m_convertableTypes,
               (const_iterator)&(this->m_convertableTypes)._M_t._M_impl.super__Rb_tree_header,
               (type_info **)((long)local_50 + lVar2),&local_30);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  LOCK();
  (this->m_num_types).super___atomic_base<unsigned_long>._M_i =
       (this->m_convertableTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  UNLOCK();
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void add_conversion(const std::shared_ptr<detail::Type_Conversion_Base> &conversion)
      {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        /// \todo error if a conversion already exists
        m_conversions.insert(conversion);
        m_convertableTypes.insert({conversion->to().bare_type_info(), conversion->from().bare_type_info()});
        m_num_types = m_convertableTypes.size();
      }